

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# garray.c
# Opt level: O0

void g_ptr_array_set_size(GPtrArray *array,gint length)

{
  uint local_28;
  guint i;
  guint length_unsigned;
  GRealPtrArray *rarray;
  gint length_local;
  GPtrArray *array_local;
  
  if (array->len < (uint)length) {
    g_ptr_array_maybe_expand((GRealPtrArray *)array,length - array->len);
    for (local_28 = array->len; local_28 < (uint)length; local_28 = local_28 + 1) {
      array->pdata[local_28] = (gpointer)0x0;
    }
  }
  else if ((uint)length < array->len) {
    g_ptr_array_remove_range(array,length,array->len - length);
  }
  array->len = length;
  return;
}

Assistant:

void g_ptr_array_set_size  (GPtrArray *array, gint length)
{
    GRealPtrArray *rarray = (GRealPtrArray *)array;
    guint length_unsigned;

    g_return_if_fail (rarray);
    g_return_if_fail (rarray->len == 0 || (rarray->len != 0 && rarray->pdata != NULL));
    g_return_if_fail (length >= 0);

    length_unsigned = (guint) length;

    if (length_unsigned > rarray->len)
    {
        guint i;
        g_ptr_array_maybe_expand (rarray, (length_unsigned - rarray->len));
        /* This is not 
         *     memset (array->pdata + array->len, 0,
         *            sizeof (gpointer) * (length_unsigned - array->len));
         * to make it really portable. Remember (void*)NULL needn't be
         * bitwise zero. It of course is silly not to use memset (..,0,..).
         */
        for (i = rarray->len; i < length_unsigned; i++)
            rarray->pdata[i] = NULL;
    }
    else if (length_unsigned < rarray->len)
        g_ptr_array_remove_range (array, length_unsigned, rarray->len - length_unsigned);

    rarray->len = length_unsigned;
}